

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureBufferActiveUniformValidation.cpp
# Opt level: O0

void __thiscall
glcts::TextureBufferActiveUniformValidationCS::configureProgram
          (TextureBufferActiveUniformValidationCS *this,
          vector<glcts::TextureParameters,_std::allocator<glcts::TextureParameters>_> *params,
          GLuint *texIds)

{
  GLuint GVar1;
  code *pcVar2;
  int iVar3;
  GLenum GVar4;
  deUint32 err;
  RenderContext *pRVar5;
  undefined4 extraout_var;
  size_type sVar6;
  reference this_00;
  uint local_2c;
  GLuint i;
  Functions *gl;
  GLuint *texIds_local;
  vector<glcts::TextureParameters,_std::allocator<glcts::TextureParameters>_> *params_local;
  TextureBufferActiveUniformValidationCS *this_local;
  
  pRVar5 = deqp::Context::getRenderContext
                     ((this->super_TextureBufferActiveUniformValidation).super_TestCaseBase.
                      m_context);
  iVar3 = (*pRVar5->_vptr_RenderContext[3])();
  local_2c = 0;
  while( true ) {
    sVar6 = std::vector<glcts::TextureParameters,_std::allocator<glcts::TextureParameters>_>::size
                      (params);
    if (sVar6 <= local_2c) break;
    pcVar2 = *(code **)(CONCAT44(extraout_var,iVar3) + 0x80);
    GVar1 = texIds[local_2c];
    this_00 = std::vector<glcts::TextureParameters,_std::allocator<glcts::TextureParameters>_>::
              operator[](params,(ulong)local_2c);
    GVar4 = TextureParameters::get_texture_format(this_00);
    (*pcVar2)(local_2c,GVar1,0,0,0,0x88b9,GVar4);
    err = (**(code **)(CONCAT44(extraout_var,iVar3) + 0x800))();
    glu::checkError(err,"Error binding texture to image unit!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferActiveUniformValidation.cpp"
                    ,0x2b1);
    local_2c = local_2c + 1;
  }
  return;
}

Assistant:

void TextureBufferActiveUniformValidationCS::configureProgram(std::vector<TextureParameters>* params,
															  glw::GLuint*					  texIds)
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	for (glw::GLuint i = 0; i < params->size(); ++i)
	{
		gl.bindImageTexture(i, texIds[i], 0, GL_FALSE, 0, GL_WRITE_ONLY, (*params)[i].get_texture_format());
		GLU_EXPECT_NO_ERROR(gl.getError(), "Error binding texture to image unit!");
	}
}